

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

_Bool CheckCollisionPointLine(Vector2 point,Vector2 p1,Vector2 p2,int threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  byte bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar5 = p2.x;
  fVar6 = p2.y;
  fVar3 = p1.x;
  fVar4 = p1.y;
  fVar1 = point.x;
  fVar2 = point.y;
  fVar8 = fVar5 - fVar3;
  fVar9 = fVar6 - fVar4;
  fVar11 = ABS(fVar8);
  fVar10 = ABS(fVar9);
  fVar12 = fVar10;
  if (fVar10 <= fVar11) {
    fVar12 = fVar11;
  }
  if ((float)(~-(uint)NAN(fVar11) & (uint)fVar12 | -(uint)NAN(fVar11) & (uint)fVar10) *
      (float)threshold <= ABS((fVar1 - fVar3) * fVar9 - (fVar2 - fVar4) * fVar8)) {
    bVar7 = 0;
  }
  else if (fVar10 <= fVar11) {
    if (fVar8 <= 0.0) {
      bVar7 = -(fVar1 <= fVar3) & -(fVar5 <= fVar1);
    }
    else {
      bVar7 = -(fVar1 <= fVar5) & -(fVar3 <= fVar1);
    }
  }
  else if (fVar9 <= 0.0) {
    bVar7 = -(fVar2 <= fVar4) & -(fVar6 <= fVar2);
  }
  else {
    bVar7 = -(fVar2 <= fVar6) & -(fVar4 <= fVar2);
  }
  return (_Bool)(bVar7 & 1);
}

Assistant:

bool CheckCollisionPointLine(Vector2 point, Vector2 p1, Vector2 p2, int threshold)
{
    bool collision = false;
    float dxc = point.x - p1.x;
    float dyc = point.y - p1.y;
    float dxl = p2.x - p1.x;
    float dyl = p2.y - p1.y;
    float cross = dxc*dyl - dyc*dxl;

    if (fabsf(cross) < (threshold*fmaxf(fabsf(dxl), fabsf(dyl))))
    {
        if (fabsf(dxl) >= fabsf(dyl)) collision = (dxl > 0)? ((p1.x <= point.x) && (point.x <= p2.x)) : ((p2.x <= point.x) && (point.x <= p1.x));
        else collision = (dyl > 0)? ((p1.y <= point.y) && (point.y <= p2.y)) : ((p2.y <= point.y) && (point.y <= p1.y));
    }
	
    return collision;
}